

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O2

Error __thiscall
asmjit::ZoneVectorBase::_reserve(ZoneVectorBase *this,ZoneHeap *heap,size_t sizeOfT,size_t n)

{
  Slot *__src;
  void *__dest;
  Error EVar1;
  size_t extraout_RDX;
  size_t size;
  ulong uVar2;
  size_t allocatedBytes;
  
  uVar2 = this->_capacity;
  EVar1 = 0;
  if (uVar2 < n) {
    if (n <= n * sizeOfT) {
      if (heap->_zone == (Zone *)0x0) {
        DebugUtils::assertionFailed
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/base/../base/zone.h"
                   ,0x18c,"isInitialized()");
      }
      __dest = ZoneHeap::_alloc(heap,n * sizeOfT,&allocatedBytes);
      if (__dest != (void *)0x0) {
        __src = (Slot *)this->_data;
        size = this->_length;
        if (size != 0) {
          memcpy(__dest,__src,size * sizeOfT);
          size = extraout_RDX;
        }
        if (__src != (Slot *)0x0) {
          if (heap->_zone == (Zone *)0x0) {
            DebugUtils::assertionFailed
                      ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/base/../base/zone.h"
                       ,0x1af,"isInitialized()");
          }
          uVar2 = uVar2 * sizeOfT;
          if (uVar2 == 0) {
            DebugUtils::assertionFailed
                      ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/base/../base/zone.h"
                       ,0x1b2,"size != 0");
          }
          if (uVar2 < 0x201) {
            if (uVar2 < 0x81) {
              uVar2 = uVar2 + 0x1fffffffff >> 5;
            }
            else {
              uVar2 = (uVar2 + 0x3fffffff7f >> 6) + 4;
            }
            __src->next = heap->_slots[uVar2 & 0xffffffff];
            heap->_slots[uVar2 & 0xffffffff] = __src;
          }
          else {
            ZoneHeap::_releaseDynamic(heap,__src,size);
          }
        }
        this->_capacity = allocatedBytes / sizeOfT;
        if (n <= allocatedBytes / sizeOfT) {
          this->_data = __dest;
          return 0;
        }
        DebugUtils::assertionFailed
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/base/zone.cpp"
                   ,0x1a1,"_capacity >= n");
      }
    }
    EVar1 = 1;
  }
  return EVar1;
}

Assistant:

Error ZoneVectorBase::_reserve(ZoneHeap* heap, size_t sizeOfT, size_t n) noexcept {
  size_t oldCapacity = _capacity;
  if (oldCapacity >= n) return kErrorOk;

  size_t nBytes = n * sizeOfT;
  if (ASMJIT_UNLIKELY(nBytes < n))
    return DebugUtils::errored(kErrorNoHeapMemory);

  size_t allocatedBytes;
  uint8_t* newData = static_cast<uint8_t*>(heap->alloc(nBytes, allocatedBytes));

  if (ASMJIT_UNLIKELY(!newData))
    return DebugUtils::errored(kErrorNoHeapMemory);

  void* oldData = _data;
  if (_length)
    ::memcpy(newData, oldData, _length * sizeOfT);

  if (oldData)
    heap->release(oldData, oldCapacity * sizeOfT);

  _capacity = allocatedBytes / sizeOfT;
  ASMJIT_ASSERT(_capacity >= n);

  _data = newData;
  return kErrorOk;
}